

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_line_bezier(rf_vec2 start_pos,rf_vec2 end_pos,float thick,rf_color color)

{
  rf_vec2 start_pos_00;
  rf_vec2 end_pos_00;
  rf_int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = start_pos.y;
  fVar6 = (end_pos.y - fVar3) * 0.5;
  lVar1 = 1;
  fVar2 = start_pos.x;
  fVar4 = fVar3;
  do {
    fVar7 = (float)lVar1 / 12.0;
    if (1.0 <= fVar7) {
      fVar7 = fVar7 + -2.0;
      fVar7 = (fVar7 * fVar7 * fVar7 + 2.0) * fVar6;
    }
    else {
      fVar7 = fVar6 * fVar7 * fVar7 * fVar7;
    }
    fVar5 = (end_pos.x - start_pos.x) / 24.0 + fVar2;
    start_pos_00.y = fVar4;
    start_pos_00.x = fVar2;
    end_pos_00.y = fVar7 + fVar3;
    end_pos_00.x = fVar5;
    rf_draw_line_ex(start_pos_00,end_pos_00,thick,color);
    lVar1 = lVar1 + 1;
    fVar2 = fVar5;
    fVar4 = fVar7 + fVar3;
  } while (lVar1 != 0x19);
  return;
}

Assistant:

RF_API void rf_draw_line_bezier(rf_vec2 start_pos, rf_vec2 end_pos, float thick, rf_color color)
{
#define RF_LINE_DIVISIONS 24 // Bezier line divisions

    rf_vec2 previous = start_pos;
    rf_vec2 current;

    for (rf_int i = 1; i <= RF_LINE_DIVISIONS; i++)
    {
        // Cubic easing in-out
        // NOTE: Easing is calculated only for y position value
        current.y = rf_shapes_ease_cubic_in_out((float)i, start_pos.y, end_pos.y - start_pos.y, (float)RF_LINE_DIVISIONS);
        current.x = previous.x + (end_pos.x - start_pos.x)/ (float)RF_LINE_DIVISIONS;

        rf_draw_line_ex(previous, current, thick, color);

        previous = current;
    }

#undef RF_LINE_DIVISIONS
}